

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.hpp
# Opt level: O0

void __thiscall
henson::Coroutine<henson::PythonPuppet>::proceed(Coroutine<henson::PythonPuppet> *this)

{
  time_type tVar1;
  long in_RDI;
  time_type diff;
  
  tVar1 = get_time();
  *(time_type *)(in_RDI + 0x30) = tVar1;
  coro_transfer(in_RDI + 0x50,in_RDI + 0x58);
  tVar1 = get_time();
  *(time_type *)(in_RDI + 0x38) = (tVar1 - *(long *)(in_RDI + 0x30)) + *(long *)(in_RDI + 0x38);
  return;
}

Assistant:

void                proceed()
    {
        start_time_ = get_time();
#ifdef USE_BOOST
        to_ = to_.resume();
#else
        coro_transfer(&from_, &to_);
#endif
        time_type diff = get_time() - start_time_;
        total_time_ += diff;
    }